

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)9>_> *
vkt::pipeline::anon_unknown_0::makeImage
          (Move<vk::Handle<(vk::HandleType)9>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkImageCreateFlags flags,VkImageType imageType,VkFormat format,IVec3 *size
          ,deUint32 numMipLevels,deUint32 numLayers,VkImageUsageFlags usage)

{
  VkExtent3D VVar1;
  VkImageType local_98;
  VkFormat VStack_94;
  deUint32 local_90;
  undefined1 local_88 [8];
  VkImageCreateInfo imageParams;
  VkFormat format_local;
  VkImageType imageType_local;
  VkImageCreateFlags flags_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  
  local_88._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext._0_4_ = flags;
  imageParams.pNext._4_4_ = imageType;
  imageParams.flags = format;
  imageParams._84_4_ = format;
  VVar1 = ::vk::makeExtent3D(size);
  _local_98 = VVar1._0_8_;
  imageParams.imageType = local_98;
  imageParams.format = VStack_94;
  local_90 = VVar1.depth;
  imageParams.extent.width = local_90;
  imageParams.extent.height = numMipLevels;
  imageParams.extent.depth = numLayers;
  imageParams.mipLevels = 1;
  imageParams.arrayLayers = 0;
  imageParams.samples = usage;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 0;
  imageParams.queueFamilyIndexCount = 0;
  imageParams._68_4_ = 0;
  imageParams.pQueueFamilyIndices._0_4_ = 0;
  ::vk::createImage(__return_storage_ptr__,vk,device,(VkImageCreateInfo *)local_88,
                    (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkImage> makeImage (const DeviceInterface&		vk,
						 const VkDevice				device,
						 VkImageCreateFlags			flags,
						 VkImageType				imageType,
						 const VkFormat				format,
						 const IVec3&				size,
						 const deUint32				numMipLevels,
						 const deUint32				numLayers,
						 const VkImageUsageFlags	usage)
{
	const VkImageCreateInfo imageParams =
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,	// VkStructureType			sType;
		DE_NULL,								// const void*				pNext;
		flags,									// VkImageCreateFlags		flags;
		imageType,								// VkImageType				imageType;
		format,									// VkFormat					format;
		makeExtent3D(size),						// VkExtent3D				extent;
		numMipLevels,							// deUint32					mipLevels;
		numLayers,								// deUint32					arrayLayers;
		VK_SAMPLE_COUNT_1_BIT,					// VkSampleCountFlagBits	samples;
		VK_IMAGE_TILING_OPTIMAL,				// VkImageTiling			tiling;
		usage,									// VkImageUsageFlags		usage;
		VK_SHARING_MODE_EXCLUSIVE,				// VkSharingMode			sharingMode;
		0u,										// deUint32					queueFamilyIndexCount;
		DE_NULL,								// const deUint32*			pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED,				// VkImageLayout			initialLayout;
	};
	return createImage(vk, device, &imageParams);
}